

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_modf(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 local_38;
  undefined8 local_28;
  lua_Number ip;
  lua_Number n;
  lua_State *L_local;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    lVar2 = luaL_checknumber(L,1);
    if (0.0 <= lVar2) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = lVar2;
      auVar4 = vroundsd_avx((undefined1  [16])0x0,auVar4,9);
      local_28 = auVar4._0_8_;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = lVar2;
      auVar4 = vroundsd_avx((undefined1  [16])0x0,auVar3,10);
      local_28 = auVar4._0_8_;
    }
    pushnumint(L,local_28);
    if ((lVar2 != local_28) || (NAN(lVar2) || NAN(local_28))) {
      local_38 = lVar2 - local_28;
    }
    else {
      local_38 = 0.0;
    }
    lua_pushnumber(L,local_38);
  }
  else {
    lua_settop(L,1);
    lua_pushnumber(L,0.0);
  }
  return 2;
}

Assistant:

static int math_modf (lua_State *L) {
  if (lua_isinteger(L ,1)) {
    lua_settop(L, 1);  /* number is its own integer part */
    lua_pushnumber(L, 0);  /* no fractional part */
  }
  else {
    lua_Number n = luaL_checknumber(L, 1);
    /* integer part (rounds toward zero) */
    lua_Number ip = (n < 0) ? l_mathop(ceil)(n) : l_mathop(floor)(n);
    pushnumint(L, ip);
    /* fractional part (test needed for inf/-inf) */
    lua_pushnumber(L, (n == ip) ? l_mathop(0.0) : (n - ip));
  }
  return 2;
}